

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O0

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verifyAll<std::initializer_list<int>>
               (string *header,initializer_list<int> *list,
               function<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *converter,
               Options *options)

{
  initializer_list<int> *in_RSI;
  initializer_list<int> *in_RDI;
  Options *in_stack_00000150;
  function<void_(const_int_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
  *in_stack_00000158;
  int **in_stack_00000160;
  int **in_stack_00000168;
  string *in_stack_00000170;
  function<void_(const_int_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
  *in_stack_ffffffffffffffa0;
  function<void_(int,_std::basic_ostream<char,_std::char_traits<char>_>_&)> local_50;
  const_iterator local_30;
  const_iterator local_28;
  
  local_28 = ::std::initializer_list<int>::begin(in_RSI);
  local_30 = ::std::initializer_list<int>::end(in_RDI);
  ::std::function<void(int_const&,std::ostream&)>::
  function<std::function<void(int,std::ostream&)>&,void>(in_stack_ffffffffffffffa0,&local_50);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
  verifyAll<const_int_*>
            (in_stack_00000170,in_stack_00000168,in_stack_00000160,in_stack_00000158,
             in_stack_00000150);
  ::std::function<void_(const_int_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)>::
  ~function((function<void_(const_int_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)> *)
            0x171a81);
  return;
}

Assistant:

static void verifyAll(
            const std::string& header,
            const Container& list,
            std::function<void(typename Container::value_type, std::ostream&)> converter,
            const Options& options = Options())
        {
            verifyAll<typename Container::const_iterator>(
                header, list.begin(), list.end(), converter, options);
        }